

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O3

unique_ptr<cmFileListGeneratorBase,_std::default_delete<cmFileListGeneratorBase>_> __thiscall
cmFileListGeneratorProject::Clone(cmFileListGeneratorProject *this)

{
  _func_int **pp_Var1;
  long in_RSI;
  
  pp_Var1 = (_func_int **)operator_new(0x20);
  pp_Var1[1] = (_func_int *)0x0;
  *pp_Var1 = (_func_int *)&PTR__cmFileListGeneratorBase_0069db28;
  pp_Var1[3] = *(_func_int **)(in_RSI + 0x18);
  pp_Var1[2] = *(_func_int **)(in_RSI + 0x10);
  (this->super_cmFileListGeneratorBase)._vptr_cmFileListGeneratorBase = pp_Var1;
  return (__uniq_ptr_data<cmFileListGeneratorBase,_std::default_delete<cmFileListGeneratorBase>,_true,_true>
          )(__uniq_ptr_data<cmFileListGeneratorBase,_std::default_delete<cmFileListGeneratorBase>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<cmFileListGeneratorBase> Clone() const override
  {
    std::unique_ptr<cmFileListGeneratorBase> g(
      new cmFileListGeneratorProject(*this));
    return g;
  }